

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::image::anon_unknown_0::LoadStoreTestInstance::verifyResult
          (TestStatus *__return_storage_ptr__,LoadStoreTestInstance *this)

{
  Texture *this_00;
  TextureFormat TVar1;
  long lVar2;
  LoadStoreTestInstance *pLVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  VkFormat format;
  DeviceInterface *pDVar7;
  VkDevice pVVar8;
  undefined4 extraout_var;
  int iVar9;
  TestStatus *pTVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  UVec4 temp;
  ConstPixelBufferAccess result;
  PixelBufferAccess reference;
  ConstPixelBufferAccess local_158;
  ulong local_130;
  PixelBufferAccess local_128;
  VkDevice local_100;
  DeviceInterface *local_f8;
  LoadStoreTestInstance *local_f0;
  undefined1 local_e8 [16];
  ConstPixelBufferAccess local_d8;
  PixelBufferAccess local_a8;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  local_158.m_data = __return_storage_ptr__;
  pDVar7 = Context::getDeviceInterface((this->super_BaseTestInstance).super_TestInstance.m_context);
  pVVar8 = Context::getDevice((this->super_BaseTestInstance).super_TestInstance.m_context);
  local_f0 = this;
  tcu::TextureLevel::getAccess(&local_a8,&this->m_referenceImage);
  local_128.super_ConstPixelBufferAccess.m_format = local_a8.super_ConstPixelBufferAccess.m_format;
  local_128.super_ConstPixelBufferAccess.m_size.m_data[0] =
       local_a8.super_ConstPixelBufferAccess.m_size.m_data[0];
  local_128.super_ConstPixelBufferAccess.m_size.m_data[1] =
       local_a8.super_ConstPixelBufferAccess.m_size.m_data[1];
  local_128.super_ConstPixelBufferAccess.m_size.m_data[2] =
       local_a8.super_ConstPixelBufferAccess.m_size.m_data[2];
  local_128.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
       local_a8.super_ConstPixelBufferAccess.m_pitch.m_data[0];
  local_128.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
       local_a8.super_ConstPixelBufferAccess.m_pitch.m_data[1];
  local_128.super_ConstPixelBufferAccess.m_pitch.m_data[2] =
       local_a8.super_ConstPixelBufferAccess.m_pitch.m_data[2];
  local_128.super_ConstPixelBufferAccess.m_data = local_a8.super_ConstPixelBufferAccess.m_data;
  iVar5 = local_a8.super_ConstPixelBufferAccess.m_size.m_data[0] + -1;
  local_130._0_4_ = local_a8.super_ConstPixelBufferAccess.m_size.m_data[0];
  local_130._4_4_ = local_a8.super_ConstPixelBufferAccess.m_size.m_data[1];
  iVar6 = (int)(((uint)((ulong)local_a8.super_ConstPixelBufferAccess.m_size.m_data._0_8_ >> 0x1f) &
                1) + local_a8.super_ConstPixelBufferAccess.m_size.m_data[0]) >> 1;
  format = ::vk::mapTextureFormat((TextureFormat *)&local_128);
  bVar4 = ::vk::isIntFormat(format);
  local_100 = pVVar8;
  local_f8 = pDVar7;
  if ((bVar4) || (bVar4 = ::vk::isUintFormat(format), bVar4)) {
    if (0 < local_128.super_ConstPixelBufferAccess.m_size.m_data[2]) {
      iVar11 = 0;
      iVar9 = local_128.super_ConstPixelBufferAccess.m_size.m_data[1];
      iVar13 = local_128.super_ConstPixelBufferAccess.m_size.m_data[2];
      do {
        if (0 < iVar9) {
          iVar14 = 0;
          do {
            if (1 < (int)local_130) {
              iVar13 = 0;
              iVar9 = iVar5;
              do {
                iVar12 = (int)&local_128;
                tcu::ConstPixelBufferAccess::getPixelInt(&local_158,iVar12,iVar9,iVar14);
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_e8,iVar12,iVar13,iVar14);
                local_d8.m_format.order = local_e8._0_4_;
                local_d8.m_format.type = local_e8._4_4_;
                local_d8.m_size.m_data[0] = local_e8._8_4_;
                local_d8.m_size.m_data[1] = local_e8._12_4_;
                tcu::PixelBufferAccess::setPixel(&local_128,(IVec4 *)&local_d8,iVar9,iVar14,iVar11);
                local_d8.m_format = local_158.m_format;
                local_d8.m_size.m_data[0] = local_158.m_size.m_data[0];
                local_d8.m_size.m_data[1] = local_158.m_size.m_data[1];
                tcu::PixelBufferAccess::setPixel(&local_128,(IVec4 *)&local_d8,iVar13,iVar14,iVar11)
                ;
                iVar13 = iVar13 + 1;
                iVar9 = iVar9 + -1;
              } while (iVar6 != iVar13);
              iVar9 = local_128.super_ConstPixelBufferAccess.m_size.m_data[1];
            }
            iVar14 = iVar14 + 1;
            iVar13 = local_128.super_ConstPixelBufferAccess.m_size.m_data[2];
          } while (iVar14 < iVar9);
        }
        iVar11 = iVar11 + 1;
      } while (iVar11 < iVar13);
    }
  }
  else if (0 < local_128.super_ConstPixelBufferAccess.m_size.m_data[2]) {
    iVar11 = 0;
    iVar9 = local_128.super_ConstPixelBufferAccess.m_size.m_data[1];
    iVar13 = local_128.super_ConstPixelBufferAccess.m_size.m_data[2];
    do {
      if (0 < iVar9) {
        iVar14 = 0;
        do {
          if (1 < (int)local_130) {
            iVar13 = 0;
            iVar9 = iVar5;
            do {
              iVar12 = (int)&local_128;
              tcu::ConstPixelBufferAccess::getPixel(&local_d8,iVar12,iVar9,iVar14);
              tcu::ConstPixelBufferAccess::getPixel(&local_158,iVar12,iVar13,iVar14);
              tcu::PixelBufferAccess::setPixel(&local_128,(Vec4 *)&local_158,iVar9,iVar14,iVar11);
              tcu::PixelBufferAccess::setPixel(&local_128,(Vec4 *)&local_d8,iVar13,iVar14,iVar11);
              iVar13 = iVar13 + 1;
              iVar9 = iVar9 + -1;
            } while (iVar6 != iVar13);
            iVar9 = local_128.super_ConstPixelBufferAccess.m_size.m_data[1];
          }
          iVar14 = iVar14 + 1;
          iVar13 = local_128.super_ConstPixelBufferAccess.m_size.m_data[2];
        } while (iVar14 < iVar9);
      }
      iVar11 = iVar11 + 1;
    } while (iVar11 < iVar13);
  }
  pLVar3 = local_f0;
  iVar5 = (*(local_f0->super_BaseTestInstance).super_TestInstance._vptr_TestInstance[10])(local_f0);
  lVar2 = *(long *)CONCAT44(extraout_var,iVar5);
  ::vk::invalidateMappedMemoryRange
            (local_f8,local_100,(VkDeviceMemory)*(deUint64 *)(lVar2 + 8),
             *(VkDeviceSize *)(lVar2 + 0x10),pLVar3->m_imageSizeBytes);
  local_e8._0_8_ = ::vk::mapVkFormat(pLVar3->m_imageFormat);
  this_00 = &(pLVar3->super_BaseTestInstance).m_texture;
  Texture::size(this_00);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_d8,(TextureFormat *)local_e8,(IVec3 *)&local_158,*(void **)(lVar2 + 0x18));
  local_58.m_format = local_a8.super_ConstPixelBufferAccess.m_format;
  local_58.m_size.m_data[0] = local_a8.super_ConstPixelBufferAccess.m_size.m_data[0];
  local_58.m_size.m_data[1] = local_a8.super_ConstPixelBufferAccess.m_size.m_data[1];
  local_58.m_size.m_data[2] = local_a8.super_ConstPixelBufferAccess.m_size.m_data[2];
  local_58.m_pitch.m_data[2] = local_a8.super_ConstPixelBufferAccess.m_pitch.m_data[2];
  local_58.m_pitch.m_data[0] = local_a8.super_ConstPixelBufferAccess.m_pitch.m_data[0];
  local_58.m_pitch.m_data[1] = local_a8.super_ConstPixelBufferAccess.m_pitch.m_data[1];
  local_58.m_data = local_a8.super_ConstPixelBufferAccess.m_data;
  local_80.m_format = local_d8.m_format;
  local_80.m_size.m_data[2] = local_d8.m_size.m_data[2];
  local_80.m_size.m_data[0] = local_d8.m_size.m_data[0];
  local_80.m_size.m_data[1] = local_d8.m_size.m_data[1];
  local_80.m_pitch.m_data[0] = local_d8.m_pitch.m_data[0];
  local_80.m_pitch.m_data[1] = local_d8.m_pitch.m_data[1];
  local_80.m_pitch.m_data[2] = local_d8.m_pitch.m_data[2];
  local_80.m_data = local_d8.m_data;
  bVar4 = comparePixelBuffers(((pLVar3->super_BaseTestInstance).super_TestInstance.m_context)->
                              m_testCtx->m_log,this_00,pLVar3->m_imageFormat,&local_58,&local_80);
  TVar1 = (TextureFormat)(local_158.m_size.m_data + 2);
  local_158.m_format = TVar1;
  if (bVar4) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Passed","");
    pTVar10 = (TestStatus *)local_158.m_data;
    *(qpTestResult *)local_158.m_data = QP_TEST_RESULT_PASS;
    (((string *)((long)local_158.m_data + 8))->_M_dataplus)._M_p =
         (pointer)&((string *)((long)local_158.m_data + 8))->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)local_158.m_data + 8),local_158.m_format,
               (undefined1 *)(local_158.m_size.m_data._0_8_ + (long)local_158.m_format));
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,"Image comparison failed","");
    pTVar10 = (TestStatus *)local_158.m_data;
    *(qpTestResult *)local_158.m_data = QP_TEST_RESULT_FAIL;
    (((string *)((long)local_158.m_data + 8))->_M_dataplus)._M_p =
         (pointer)&((string *)((long)local_158.m_data + 8))->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)local_158.m_data + 8),local_158.m_format,
               (undefined1 *)(local_158.m_size.m_data._0_8_ + (long)local_158.m_format));
  }
  if (local_158.m_format != TVar1) {
    operator_delete((void *)local_158.m_format,local_158._16_8_ + 1);
  }
  return pTVar10;
}

Assistant:

tcu::TestStatus LoadStoreTestInstance::verifyResult	(void)
{
	const DeviceInterface&	vk		= m_context.getDeviceInterface();
	const VkDevice			device	= m_context.getDevice();

	// Apply the same transformation as done in the shader
	const tcu::PixelBufferAccess reference = m_referenceImage.getAccess();
	flipHorizontally(reference);

	const Allocation& alloc = getResultBuffer()->getAllocation();
	invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), m_imageSizeBytes);
	const tcu::ConstPixelBufferAccess result(mapVkFormat(m_imageFormat), m_texture.size(), alloc.getHostPtr());

	if (comparePixelBuffers(m_context.getTestContext().getLog(), m_texture, m_imageFormat, reference, result))
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Image comparison failed");
}